

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O1

Expression __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::BuildGraph
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          vector<int,_std::allocator<int>_> *ctx,Expression *coverage,Expression *fertility)

{
  int iVar1;
  AttentionalModel<dynet::LSTMBuilder> *pAVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  uint uVar4;
  undefined8 extraout_RDX;
  ulong uVar6;
  Expression EVar7;
  undefined8 *in_stack_00000018;
  Expression mu_trim;
  Expression var_trim;
  Expression var;
  Expression mu;
  Expression vbias;
  Expression i_penalty;
  Expression i_err;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> errs;
  Expression *i_nerr;
  Expression partition;
  Expression delta;
  Expression mbias;
  Expression i_total_trim;
  Expression exponent;
  Expression i_totals;
  undefined1 local_180 [24];
  Expression local_168;
  Expression local_158;
  Expression local_148;
  Expression local_138;
  value_type local_128;
  Expression local_118;
  value_type local_108;
  Expression local_f8;
  Expression local_e8;
  vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> local_d8;
  AttentionalModel<dynet::LSTMBuilder> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  Expression local_b0;
  Expression local_a0;
  Expression local_90;
  value_type local_80;
  Expression local_70;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  undefined8 uVar5;
  
  local_c0 = this;
  local_b8 = ctx;
  start_new_instance((AttentionalModel<dynet::LSTMBuilder> *)source,target,
                     (ComputationGraph *)alignment,(vector<int,_std::allocator<int>_> *)coverage);
  local_d8.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = (int)((ulong)(*(long *)(cg + 8) - *(long *)cg) >> 2) - 1;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      add_input((AttentionalModel<dynet::LSTMBuilder> *)local_180,(int)source,
                *(int *)(*(long *)cg + uVar6 * 4),(ComputationGraph *)(uVar6 & 0xffffffff),
                (RNNPointer *)alignment);
      dynet::expr::pickneglogsoftmax
                (&local_e8,(uint)(AttentionalModel<dynet::LSTMBuilder> *)local_180);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::push_back
                (&local_d8,&local_e8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  pvVar3 = local_b8;
  if (local_b8 != (vector<int,_std::allocator<int>_> *)0x0) {
    expr::detail::
    f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
              ((detail *)local_180,
               (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
               &source[0x30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_180._0_8_;
    *(undefined4 *)
     &(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = local_180._8_4_;
  }
  if (fertility != (Expression *)0x0 || in_stack_00000018 != (undefined8 *)0x0) {
    if (pvVar3 == (vector<int,_std::allocator<int>_> *)0x0) {
      expr::detail::
      f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((detail *)&local_e8,
                 (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 &source[0x30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
    else {
      local_e8.pg = (ComputationGraph *)
                    (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      local_e8.i.t = *(uint *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish;
    }
    dynet::expr::sum_cols(&local_40);
    dynet::expr::pickrange(&local_70,(uint)&local_40,1);
    if (fertility != (Expression *)0x0) {
      iVar1 = *(int *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
      auxiliary_vector((AttentionalModel<dynet::LSTMBuilder> *)source);
      repeat((ComputationGraph *)local_180,(uint)alignment,1.0,
             (vector<float,_std::allocator<float>_> *)(ulong)(iVar1 - 2));
      dynet::expr::squared_distance(&local_f8,&local_70);
      fertility->pg = local_f8.pg;
      (fertility->i).t = local_f8.i.t;
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      if (*(char *)((long)&source[0x26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 5) == '\0') {
        __assert_fail("global_fertility",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.h"
                      ,0x1c4,
                      "Expression dynet::AttentionalModel<dynet::LSTMBuilder>::BuildGraph(const std::vector<int> &, const std::vector<int> &, ComputationGraph &, Expression *, const std::vector<int> *, Expression *, Expression *) [Builder = dynet::LSTMBuilder]"
                     );
      }
      uVar4 = *(uint *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4);
      dynet::expr::parameter
                (&local_80,alignment,
                 source[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 source[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_180,(ulong)uVar4,&local_80,(allocator_type *)&local_108);
      expr::detail::
      f<dynet::ConcatenateColumns,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((detail *)&local_f8,
                 (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_180);
      if ((pointer)local_180._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_180._0_8_);
      }
      uVar4 = *(uint *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4);
      dynet::expr::parameter
                (&local_108,alignment,
                 source[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 source[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_180,(ulong)uVar4,&local_108,(allocator_type *)&local_128);
      expr::detail::
      f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((detail *)&local_80,
                 (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_180);
      if ((pointer)local_180._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_180._0_8_);
      }
      uVar4 = *(uint *)((long)&source[0x32].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 4);
      dynet::expr::parameter
                (&local_128,alignment,
                 source[0xb].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 source[0xc].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>::vector
                ((vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_180,(ulong)uVar4,&local_128,(allocator_type *)&local_138);
      expr::detail::
      f<dynet::Concatenate,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                ((detail *)&local_108,
                 (vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *)
                 local_180);
      if ((pointer)local_180._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_180._0_8_);
      }
      dynet::expr::parameter
                (&local_148,alignment,
                 source[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 source[8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      dynet::expr::operator*(&local_168,&local_148);
      dynet::expr::operator+(&local_138,&local_f8);
      dynet::expr::transpose(&local_128);
      dynet::expr::tanh((Expression *)local_180);
      dynet::expr::parameter
                (&local_168,alignment,
                 source[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 source[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      dynet::expr::operator*(&local_138,(Expression *)local_180);
      dynet::expr::operator+(&local_128,&local_80);
      dynet::expr::parameter
                (&local_90,alignment,
                 source[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 source[10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dynet::expr::operator*(&local_148,(Expression *)local_180);
      dynet::expr::operator+(&local_168,&local_108);
      dynet::expr::exp(&local_138);
      dynet::expr::pickrange(&local_168,(uint)&local_128,1);
      dynet::expr::pickrange(&local_148,(uint)&local_138,1);
      dynet::expr::operator-(&local_90,&local_70);
      dynet::expr::cmult(&local_158,&local_90);
      dynet::expr::operator-((expr *)&local_a0,&local_158);
      dynet::expr::operator*(&local_118,2.0);
      dynet::expr::cdiv(&local_50,&local_a0);
      dynet::expr::operator*(&local_b0,2.0);
      dynet::expr::operator*(&local_118,3.1415927);
      dynet::expr::log(&local_158);
      dynet::expr::operator*(&local_a0,-0.5);
      dynet::expr::operator+(&local_60,&local_a0);
      dynet::expr::transpose(&local_b0);
      dynet::expr::sum_cols(&local_118);
      dynet::expr::operator-((expr *)&local_158,&local_118);
      *in_stack_00000018 = local_158.pg;
      *(uint *)(in_stack_00000018 + 1) = local_158.i.t;
    }
  }
  pAVar2 = local_c0;
  EVar7 = expr::detail::
          f<dynet::Sum,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
                    ((detail *)local_c0,&local_d8);
  uVar5 = EVar7._8_8_;
  if (local_d8.super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar5 = extraout_RDX;
  }
  EVar7._8_8_ = uVar5;
  EVar7.pg = (ComputationGraph *)pAVar2;
  return EVar7;
}

Assistant:

Expression AttentionalModel<Builder>::BuildGraph(const std::vector<int> &source,
        const std::vector<int>& target, ComputationGraph& cg, Expression *alignment,
        const std::vector<int>* ctx, Expression *coverage, Expression *fertility) 
{
    //std::cout << "source sentence length: " << source.size() << " target: " << target.size() << std::endl;
    start_new_instance(source, cg, ctx);

    std::vector<Expression> errs;
    const unsigned tlen = target.size() - 1; 
    for (unsigned t = 0; t < tlen; ++t) {
        Expression i_r_t = add_input(target[t], t, cg);
        Expression i_err = pickneglogsoftmax(i_r_t, target[t+1]);
        errs.push_back(i_err);
    }
    // save the alignment for later
    if (alignment != 0) {
	// pop off the last alignment column
        *alignment = concatenate_cols(aligns);
    }

    // AM paper (vision one) has a penalty over alignment rows deviating from 1
    if (coverage != nullptr || fertility != nullptr) {
        Expression i_aligns = (alignment != 0) ? *alignment : concatenate_cols(aligns);
        Expression i_totals = sum_cols(i_aligns);
        // only care about the non-null entries
        Expression i_total_trim = pickrange(i_totals, 1, slen-1);

        if (coverage != nullptr) {
            Expression i_ones = repeat(cg, slen-2, 1.0f, auxiliary_vector());
            Expression i_penalty = squared_distance(i_total_trim, i_ones);
            *coverage = i_penalty;
        } 

        if (fertility != nullptr) {
            assert(global_fertility);

            Expression fbias = concatenate_cols(std::vector<Expression>(slen, parameter(cg, p_bfhid)));
            Expression mbias = concatenate(std::vector<Expression>(slen, parameter(cg, p_bfmu)));
            Expression vbias = concatenate(std::vector<Expression>(slen, parameter(cg, p_bfvar)));
            Expression fhid = tanh(transpose(fbias + parameter(cg, p_Wfhid) * src));  
            Expression mu = mbias + fhid * parameter(cg, p_Wfmu);
            Expression var = exp(vbias + fhid * parameter(cg, p_Wfvar));

            Expression mu_trim = pickrange(mu, 1, slen-1);
            Expression var_trim = pickrange(var, 1, slen-1);

#if 0
            /* log-Normal distribution */
            Expression log_fert = log(i_total_trim);
            Expression delta = log_fert - mu_trim;
            Expression exponent = cdiv(-cmult(delta, delta), 2.0f * var_trim);
            Expression partition = -log_fert - 0.5 * log(2.0f * var_trim * 3.14159265359);
            *fertility = -sum_cols(transpose(partition + exponent));
#else
            /* Normal distribution */
            Expression delta = i_total_trim - mu_trim;
            Expression exponent = cdiv(-cmult(delta, delta), 2.0f * var_trim);
            Expression partition = -0.5 * log(2.0f * var_trim * 3.14159265359);
            *fertility = -sum_cols(transpose(partition + exponent));
            // note that as this is the value of the normal density, the errors
            // are not strictly positive
#endif

            //LOLCAT(transpose(i_total_trim));
            //LOLCAT(transpose(mu_trim));
            //LOLCAT(transpose(var_trim));
            //LOLCAT(transpose(partition + exponent));
            //LOLCAT(exp(transpose(partition + exponent)));
        }
    }

    Expression i_nerr = sum(errs);
    return i_nerr;
}